

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int set_array_length(JSContext *ctx,JSObject *p,JSValue val,int flags)

{
  JSVarRef **ppJVar1;
  JSProperty *pJVar2;
  int iVar3;
  BOOL BVar4;
  JSAtom JVar5;
  uint uVar6;
  double dVar7;
  JSValueUnion JVar8;
  int64_t iVar9;
  JSValueUnion JVar10;
  JSShape *pJVar11;
  ulong uVar12;
  JSShape *pJVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  double dVar17;
  JSValue v;
  JSValue new_val;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint32_t idx;
  uint32_t len;
  JSShape *local_38;
  
  iVar3 = JS_ToArrayLengthFree(ctx,&len,val,0);
  if (iVar3 == 0) {
    if ((p->shape[1].header.ref_count & 0x8000000) == 0) {
      iVar3 = JS_ThrowTypeErrorReadOnly(ctx,flags,0x30);
      return iVar3;
    }
    if (((p->field_0).header.dummy1 & 8) == 0) {
      JS_ToInt32(ctx,(int32_t *)&local_4c,*(JSValue *)p->prop);
      local_44 = len;
      if (len < local_4c) {
        pJVar13 = p->shape;
        uVar6 = pJVar13->prop_count;
        uVar14 = local_4c;
        if (uVar6 < local_4c - len) {
          local_4c = len;
          pJVar11 = pJVar13 + 1;
          local_48 = len;
          for (lVar15 = 0; (int)lVar15 < (int)uVar6; lVar15 = lVar15 + 1) {
            JVar5 = *(JSAtom *)(&pJVar13[1].header.field_0x4 + lVar15 * 8);
            if ((((JVar5 != 0) && (BVar4 = JS_AtomIsArrayIndex(ctx,&idx,JVar5), BVar4 != 0)) &&
                (local_48 <= idx)) &&
               ((*(byte *)((long)&pJVar13[1].header.ref_count + lVar15 * 8 + 3) & 4) == 0)) {
              local_48 = idx + 1;
            }
            uVar6 = pJVar13->prop_count;
          }
          local_4c = local_48;
          lVar15 = 0x40;
          for (lVar16 = 0; lVar16 < (int)uVar6; lVar16 = lVar16 + 1) {
            JVar5 = *(JSAtom *)&(pJVar11->header).field_0x4;
            if (((JVar5 != 0) &&
                (local_38 = pJVar13, BVar4 = JS_AtomIsArrayIndex(ctx,&idx,JVar5), pJVar13 = local_38
                , BVar4 != 0)) && (local_48 <= idx)) {
              delete_property(ctx,p,*(JSAtom *)&(pJVar11->header).field_0x4);
              pJVar11 = (JSShape *)((long)&(p->shape->header).ref_count + lVar15);
              pJVar13 = p->shape;
            }
            pJVar11 = (JSShape *)&(pJVar11->header).link;
            uVar6 = pJVar13->prop_count;
            lVar15 = lVar15 + 8;
          }
        }
        else {
          for (; local_4c = uVar14, local_44 < uVar14; uVar14 = uVar14 - 1) {
            JVar5 = JS_NewAtomUInt32(ctx,uVar14 - 1);
            iVar3 = delete_property(ctx,p,JVar5);
            JS_FreeAtom(ctx,JVar5);
            if (iVar3 == 0) break;
          }
        }
      }
      else {
        local_4c = len;
      }
      JVar8._4_4_ = 0;
      JVar8.int32 = local_4c;
      JVar10.float64 = (double)JVar8.float64;
      if (-1 < (int)local_4c) {
        JVar10 = JVar8;
      }
      iVar9 = 7;
      if (-1 < (int)local_4c) {
        iVar9 = 0;
      }
      new_val.tag = iVar9;
      new_val.u.float64 = JVar10.float64;
      set_value(ctx,(JSValue *)p->prop,new_val);
      if (local_44 < local_4c) {
        iVar3 = JS_ThrowTypeErrorOrFalse(ctx,flags,"not configurable");
        return iVar3;
      }
    }
    else {
      uVar6 = (p->u).array.count;
      dVar17 = (double)(ulong)len;
      if (len < uVar6) {
        uVar12 = (long)(int)len << 4 | 8;
        for (dVar7 = dVar17; SUB84(dVar7,0) < uVar6; dVar7 = (double)(ulong)(SUB84(dVar7,0) + 1)) {
          ppJVar1 = (p->u).func.var_refs;
          v.tag = *(int64_t *)((long)ppJVar1 + uVar12);
          v.u.ptr = ((JSValueUnion *)((long)ppJVar1 + (uVar12 - 8)))->ptr;
          JS_FreeValue(ctx,v);
          uVar12 = uVar12 + 0x10;
        }
        (p->u).array.count = len;
      }
      dVar7 = (double)(long)dVar17;
      if (-1 < (int)len) {
        dVar7 = dVar17;
      }
      iVar9 = 7;
      if (-1 < (int)len) {
        iVar9 = 0;
      }
      pJVar2 = p->prop;
      *(double *)&pJVar2->u = dVar7;
      (pJVar2->u).value.tag = iVar9;
    }
    iVar3 = 1;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

static int set_array_length(JSContext *ctx, JSObject *p, JSValue val,
                            int flags)
{
    uint32_t len, idx, cur_len;
    int i, ret;

    /* Note: this call can reallocate the properties of 'p' */
    ret = JS_ToArrayLengthFree(ctx, &len, val, FALSE);
    if (ret)
        return -1;
    /* JS_ToArrayLengthFree() must be done before the read-only test */
    if (unlikely(!(p->shape->prop[0].flags & JS_PROP_WRITABLE)))
        return JS_ThrowTypeErrorReadOnly(ctx, flags, JS_ATOM_length);

    if (likely(p->fast_array)) {
        uint32_t old_len = p->u.array.count;
        if (len < old_len) {
            for(i = len; i < old_len; i++) {
                JS_FreeValue(ctx, p->u.array.u.values[i]);
            }
            p->u.array.count = len;
        }
        p->prop[0].u.value = JS_NewUint32(ctx, len);
    } else {
        /* Note: length is always a uint32 because the object is an
           array */
        JS_ToUint32(ctx, &cur_len, p->prop[0].u.value);
        if (len < cur_len) {
            uint32_t d;
            JSShape *sh;
            JSShapeProperty *pr;

            d = cur_len - len;
            sh = p->shape;
            if (d <= sh->prop_count) {
                JSAtom atom;

                /* faster to iterate */
                while (cur_len > len) {
                    atom = JS_NewAtomUInt32(ctx, cur_len - 1);
                    ret = delete_property(ctx, p, atom);
                    JS_FreeAtom(ctx, atom);
                    if (unlikely(!ret)) {
                        /* unlikely case: property is not
                           configurable */
                        break;
                    }
                    cur_len--;
                }
            } else {
                /* faster to iterate thru all the properties. Need two
                   passes in case one of the property is not
                   configurable */
                cur_len = len;
                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len &&
                            !(pr->flags & JS_PROP_CONFIGURABLE)) {
                            cur_len = idx + 1;
                        }
                    }
                }

                for(i = 0, pr = get_shape_prop(sh); i < sh->prop_count;
                    i++, pr++) {
                    if (pr->atom != JS_ATOM_NULL &&
                        JS_AtomIsArrayIndex(ctx, &idx, pr->atom)) {
                        if (idx >= cur_len) {
                            /* remove the property */
                            delete_property(ctx, p, pr->atom);
                            /* WARNING: the shape may have been modified */
                            sh = p->shape;
                            pr = get_shape_prop(sh) + i;
                        }
                    }
                }
            }
        } else {
            cur_len = len;
        }
        set_value(ctx, &p->prop[0].u.value, JS_NewUint32(ctx, cur_len));
        if (unlikely(cur_len > len)) {
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "not configurable");
        }
    }
    return TRUE;
}